

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadContactSurfaceMesh::LoadStateIncrement
          (ChLoadContactSurfaceMesh *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  int iVar4;
  pointer psVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  
  psVar5 = (this->forces).
           super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->forces).
      super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    lVar8 = 0;
    uVar10 = 0;
    iVar9 = 0;
    iVar6 = 0;
    do {
      lVar1 = *(long *)((long)&(psVar5->
                               super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
      plVar7 = *(long **)(lVar1 + 0x58);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)((long)plVar7 + *(long *)(*plVar7 + -0x78));
      }
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x60);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (**(code **)(*plVar7 + 0x30))(plVar7,iVar6,x_new,x,iVar9,dw);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      lVar1 = *(long *)((long)&(((this->forces).
                                 super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
      plVar7 = *(long **)(lVar1 + 0x58);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)((long)plVar7 + *(long *)(*plVar7 + -0x78));
      }
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x60);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      iVar3 = (**(code **)(*plVar7 + 0x10))();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      lVar1 = *(long *)((long)&(((this->forces).
                                 super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
      plVar7 = *(long **)(lVar1 + 0x58);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)((long)plVar7 + *(long *)(*plVar7 + -0x78));
      }
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x60);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      iVar4 = (**(code **)(*plVar7 + 0x18))();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar5 = (this->forces).
               super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x10;
      iVar6 = iVar6 + iVar3;
      iVar9 = iVar9 + iVar4;
    } while (uVar10 < (ulong)((long)(this->forces).
                                    super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4))
    ;
  }
  return;
}

Assistant:

void ChLoadContactSurfaceMesh::LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    int ndoftotx = 0;
    int ndoftotw = 0;
    for (int i = 0; i < forces.size(); ++i) {
        forces[i]->loader.GetLoadable()->LoadableStateIncrement(ndoftotx, x_new, x, ndoftotw, dw);
        ndoftotx += forces[i]->loader.GetLoadable()->LoadableGet_ndof_x();
        ndoftotw += forces[i]->loader.GetLoadable()->LoadableGet_ndof_w();
    }
}